

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O0

string * __thiscall FIX::FieldMap::calculateString(FieldMap *this,string *result)

{
  bool bVar1;
  string *psVar2;
  size_type sVar3;
  pointer ppVar4;
  reference ppFVar5;
  FieldMap **group;
  const_iterator __end2;
  const_iterator __begin2;
  vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_> *__range2;
  int local_44;
  _Self local_40;
  const_iterator tagWithGroups;
  FieldBase *field;
  const_iterator __end1;
  const_iterator __begin1;
  Fields *__range1;
  string *result_local;
  FieldMap *this_local;
  
  __end1 = std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::begin(&this->m_fields);
  field = (FieldBase *)
          std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::end(&this->m_fields);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
                                     *)&field), bVar1) {
    tagWithGroups._M_node =
         (_Base_ptr)
         __gnu_cxx::
         __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
         ::operator*(&__end1);
    psVar2 = FieldBase::getFixString_abi_cxx11_((FieldBase *)tagWithGroups._M_node);
    std::__cxx11::string::operator+=((string *)result,(string *)psVar2);
    sVar3 = std::
            map<int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
            ::size(&this->m_groups);
    if (sVar3 != 0) {
      local_44 = FieldBase::getTag((FieldBase *)tagWithGroups._M_node);
      local_40._M_node =
           (_Base_ptr)
           std::
           map<int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
           ::find(&this->m_groups,&local_44);
      __range2 = (vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_> *)
                 std::
                 map<int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
                 ::end(&this->m_groups);
      bVar1 = std::operator==(&local_40,(_Self *)&__range2);
      if (!bVar1) {
        ppVar4 = std::
                 _Rb_tree_const_iterator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>
                 ::operator->(&local_40);
        __end2 = std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>::begin
                           (&ppVar4->second);
        group = (FieldMap **)
                std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>::end(&ppVar4->second)
        ;
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
                                           *)&group), bVar1) {
          ppFVar5 = __gnu_cxx::
                    __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
                    ::operator*(&__end2);
          calculateString(*ppFVar5,result);
          __gnu_cxx::
          __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
          ::operator++(&__end2);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
    ::operator++(&__end1);
  }
  return result;
}

Assistant:

std::string &FieldMap::calculateString(std::string &result) const {
  for (auto const &field : m_fields) {
    result += field.getFixString();

    // add groups if they exist
    if (!m_groups.size()) {
      continue;
    }

    Groups::const_iterator tagWithGroups = m_groups.find(field.getTag());
    if (tagWithGroups == m_groups.end()) {
      continue;
    }

    for (auto const &group : tagWithGroups->second) {
      group->calculateString(result);
    }
  }
  return result;
}